

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::FenceVkImpl::Reset(FenceVkImpl *this,Uint64 Value)

{
  undefined8 uVar1;
  bool bVar2;
  Char *pCVar3;
  undefined4 in_stack_ffffffffffffff48;
  undefined1 local_88 [8];
  string msg_1;
  lock_guard<std::mutex> Lock;
  undefined1 local_50 [8];
  string msg;
  Uint64 Value_local;
  FenceVkImpl *this_local;
  memory_order __b;
  
  msg.field_2._8_8_ = Value;
  bVar2 = IsTimelineSemaphore(this);
  if (bVar2) {
    FormatString<char[48]>
              ((string *)local_50,(char (*) [48])"Reset() is not supported for timeline semaphore");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"Reset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
               ,0xb6);
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)((long)&msg_1.field_2 + 8),&this->m_SyncPointsGuard);
    uVar1 = msg.field_2._8_8_;
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    if ((ulong)uVar1 <
        (this->super_FenceBase<Diligent::EngineVkImplTraits>).m_LastCompletedFenceValue.
        super___atomic_base<unsigned_long>._M_i) {
      FormatString<char[18],char_const*,char[17],unsigned_long,char[50],std::atomic<unsigned_long>,char[2]>
                ((string *)local_88,(Diligent *)"Resetting fence \'",
                 (char (*) [18])
                 &(this->super_FenceBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                  .m_Desc,(char **)"\' to the value (",(char (*) [17])((long)&msg.field_2 + 8),
                 (unsigned_long *)") that is smaller than the last completed value (",
                 (char (*) [50])
                 &(this->super_FenceBase<Diligent::EngineVkImplTraits>).m_LastCompletedFenceValue,
                 (atomic<unsigned_long> *)0xcabce5,
                 (char (*) [2])CONCAT44(5,in_stack_ffffffffffffff48));
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"Reset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                 ,0xbc);
      std::__cxx11::string::~string((string *)local_88);
    }
    FenceBase<Diligent::EngineVkImplTraits>::UpdateLastCompletedFenceValue
              (&this->super_FenceBase<Diligent::EngineVkImplTraits>,msg.field_2._8_8_);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)((long)&msg_1.field_2 + 8));
  }
  return;
}

Assistant:

void FenceVkImpl::Reset(Uint64 Value)
{
    if (IsTimelineSemaphore())
    {
        DEV_ERROR("Reset() is not supported for timeline semaphore");
    }
    else
    {
        std::lock_guard<std::mutex> Lock{m_SyncPointsGuard};

        DEV_CHECK_ERR(Value >= m_LastCompletedFenceValue.load(), "Resetting fence '", m_Desc.Name, "' to the value (", Value, ") that is smaller than the last completed value (", m_LastCompletedFenceValue, ")");
        UpdateLastCompletedFenceValue(Value);
    }
}